

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECoordinates.cpp
# Opt level: O0

string * __thiscall CECoordinates::print_abi_cxx11_(CECoordinates *this)

{
  long *in_RSI;
  string *in_RDI;
  double dVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  string *msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe88;
  string local_148 [20];
  int in_stack_fffffffffffffecc;
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  string local_48 [54];
  allocator local_12;
  undefined1 local_11;
  
  local_11 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,"Coordinates:\n",&local_12);
  std::allocator<char>::~allocator((allocator<char> *)&local_12);
  std::__cxx11::to_string(in_stack_fffffffffffffecc);
  std::operator+((char *)in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
  std::operator+(in_stack_fffffffffffffe88,(char *)in_stack_fffffffffffffe80);
  std::__cxx11::string::operator+=((string *)in_RDI,local_48);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_88);
  dVar1 = CppEphem::julian_date_J2000();
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          (**(code **)(*in_RSI + 0x30))(dVar1);
  std::__cxx11::to_string((double)__lhs);
  std::operator+((char *)__lhs,in_stack_fffffffffffffe80);
  std::operator+(__lhs,(char *)in_stack_fffffffffffffe80);
  std::__cxx11::string::operator+=((string *)in_RDI,local_a8);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string(local_c8);
  std::__cxx11::string::~string(local_e8);
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          CppEphem::julian_date_J2000();
  (**(code **)(*in_RSI + 0x40))(__rhs);
  std::__cxx11::to_string((double)__lhs);
  std::operator+((char *)__lhs,__rhs);
  std::operator+(__lhs,(char *)__rhs);
  std::__cxx11::string::operator+=((string *)in_RDI,local_108);
  std::__cxx11::string::~string(local_108);
  std::__cxx11::string::~string(local_128);
  std::__cxx11::string::~string(local_148);
  return in_RDI;
}

Assistant:

std::string CECoordinates::print(void) const
{
    std::string msg = "Coordinates:\n";
    msg += "   - System : " + std::to_string(int(coord_type_)) + "\n";
    msg += "   - X-coord: " + std::to_string(XCoordinate_Deg()) + " deg\n";
    msg += "   - Y-coord: " + std::to_string(YCoordinate_Deg()) + " deg\n";
    return msg;
}